

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::
SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
::
emplace_back<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
          (SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
           *this,pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
                 *args)

{
  ulong uVar1;
  Symbol *pSVar2;
  ConfigBlockSymbol *pCVar3;
  HierarchicalInstanceSyntax *pHVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  EVP_PKEY_CTX *pEVar12;
  undefined8 *puVar13;
  EVP_PKEY_CTX *ctx;
  long lVar14;
  
  puVar13 = (undefined8 *)(*(long *)(this + 8) * 0x20 + *(long *)this);
  if (*(long *)(this + 8) != *(long *)(this + 0x10)) {
    pSVar2 = (args->first).definition;
    pCVar3 = (args->first).configRoot;
    pHVar4 = args->second;
    puVar13[2] = (args->first).configRule;
    puVar13[3] = pHVar4;
    *puVar13 = pSVar2;
    puVar13[1] = pCVar3;
    lVar14 = *(long *)(this + 8);
    *(long *)(this + 8) = lVar14 + 1;
    return (reference)(*(long *)this + (lVar14 + 1) * 0x20 + -0x20);
  }
  if (*(long *)(this + 8) == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar12 = (EVP_PKEY_CTX *)(*(long *)(this + 8) + 1);
  uVar1 = *(ulong *)(this + 0x10);
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar12 < ctx) {
    pEVar12 = ctx;
  }
  if (0x3ffffffffffffff - uVar1 < uVar1) {
    pEVar12 = (EVP_PKEY_CTX *)0x3ffffffffffffff;
  }
  lVar14 = (long)puVar13 - *(long *)this;
  puVar8 = (undefined8 *)operator_new((long)pEVar12 << 5);
  pSVar2 = (args->first).definition;
  pCVar3 = (args->first).configRoot;
  pHVar4 = args->second;
  puVar11 = (undefined8 *)((long)puVar8 + lVar14 + 0x10);
  *puVar11 = (args->first).configRule;
  puVar11[1] = pHVar4;
  *(undefined8 *)((long)puVar8 + lVar14) = pSVar2;
  ((undefined8 *)((long)puVar8 + lVar14))[1] = pCVar3;
  puVar11 = *(undefined8 **)this;
  puVar9 = puVar11 + *(long *)(this + 8) * 4;
  puVar10 = puVar8;
  if (puVar9 == puVar13) {
    for (; puVar11 != puVar13; puVar11 = puVar11 + 4) {
      uVar5 = *puVar11;
      uVar6 = puVar11[1];
      uVar7 = puVar11[3];
      puVar10[2] = puVar11[2];
      puVar10[3] = uVar7;
      *puVar10 = uVar5;
      puVar10[1] = uVar6;
      puVar10 = puVar10 + 4;
    }
  }
  else {
    for (; puVar11 != puVar13; puVar11 = puVar11 + 4) {
      uVar5 = *puVar11;
      uVar6 = puVar11[1];
      uVar7 = puVar11[3];
      puVar10[2] = puVar11[2];
      puVar10[3] = uVar7;
      *puVar10 = uVar5;
      puVar10[1] = uVar6;
      puVar10 = puVar10 + 4;
    }
    puVar11 = (undefined8 *)(lVar14 + (long)puVar8);
    for (; puVar13 != puVar9; puVar13 = puVar13 + 4) {
      uVar5 = *puVar13;
      uVar6 = puVar13[1];
      uVar7 = puVar13[3];
      puVar11[6] = puVar13[2];
      puVar11[7] = uVar7;
      puVar11[4] = uVar5;
      puVar11[5] = uVar6;
      puVar11 = puVar11 + 4;
    }
  }
  SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
  ::cleanup((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
             *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(EVP_PKEY_CTX **)(this + 0x10) = pEVar12;
  *(undefined8 **)this = puVar8;
  return (reference)((long)puVar8 + lVar14);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }